

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O2

void __thiscall ncnn::MultiHeadAttention::MultiHeadAttention(MultiHeadAttention *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__MultiHeadAttention_005b6258;
  (this->v_weight_data_int8_scales).cstep = 0;
  (this->q_weight_data).data = (void *)0x0;
  (this->q_weight_data).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->q_weight_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->q_weight_data).elemsize + 4) = 0;
  (this->q_weight_data).allocator = (Allocator *)0x0;
  (this->q_weight_data).dims = 0;
  (this->q_weight_data).w = 0;
  (this->q_weight_data).w = 0;
  (this->q_weight_data).h = 0;
  (this->q_weight_data).d = 0;
  (this->q_weight_data).c = 0;
  (this->q_weight_data).cstep = 0;
  (this->q_bias_data).data = (void *)0x0;
  (this->q_bias_data).refcount = (int *)0x0;
  (this->q_bias_data).elemsize = 0;
  (this->q_bias_data).elempack = 0;
  (this->q_bias_data).allocator = (Allocator *)0x0;
  (this->q_bias_data).dims = 0;
  (this->q_bias_data).w = 0;
  (this->q_bias_data).w = 0;
  (this->q_bias_data).h = 0;
  (this->q_bias_data).d = 0;
  (this->q_bias_data).c = 0;
  (this->k_weight_data).elempack = 0;
  (this->q_bias_data).cstep = 0;
  (this->k_weight_data).data = (void *)0x0;
  (this->k_weight_data).refcount = (int *)0x0;
  (this->k_weight_data).elemsize = 0;
  (this->k_weight_data).allocator = (Allocator *)0x0;
  (this->k_weight_data).dims = 0;
  (this->k_weight_data).w = 0;
  (this->k_weight_data).w = 0;
  (this->k_weight_data).h = 0;
  (this->k_weight_data).d = 0;
  (this->k_weight_data).c = 0;
  (this->k_weight_data).cstep = 0;
  (this->k_bias_data).data = (void *)0x0;
  (this->k_bias_data).elempack = 0;
  (this->k_bias_data).refcount = (int *)0x0;
  (this->k_bias_data).elemsize = 0;
  (this->k_bias_data).w = 0;
  (this->k_bias_data).h = 0;
  (this->k_bias_data).d = 0;
  (this->k_bias_data).c = 0;
  (this->k_bias_data).allocator = (Allocator *)0x0;
  (this->k_bias_data).dims = 0;
  (this->k_bias_data).w = 0;
  (this->v_weight_data).refcount = (int *)0x0;
  (this->v_weight_data).elemsize = 0;
  (this->k_bias_data).cstep = 0;
  (this->v_weight_data).data = (void *)0x0;
  (this->v_weight_data).elempack = 0;
  (this->v_weight_data).w = 0;
  (this->v_weight_data).h = 0;
  (this->v_weight_data).d = 0;
  (this->v_weight_data).c = 0;
  (this->v_weight_data).allocator = (Allocator *)0x0;
  (this->v_weight_data).dims = 0;
  (this->v_weight_data).w = 0;
  (this->v_bias_data).refcount = (int *)0x0;
  (this->v_bias_data).elemsize = 0;
  (this->v_weight_data).cstep = 0;
  (this->v_bias_data).data = (void *)0x0;
  (this->v_bias_data).elempack = 0;
  (this->v_bias_data).w = 0;
  (this->v_bias_data).h = 0;
  (this->v_bias_data).d = 0;
  (this->v_bias_data).c = 0;
  (this->v_bias_data).allocator = (Allocator *)0x0;
  (this->v_bias_data).dims = 0;
  (this->v_bias_data).w = 0;
  (this->out_weight_data).elempack = 0;
  (this->out_weight_data).refcount = (int *)0x0;
  (this->out_weight_data).elemsize = 0;
  (this->v_bias_data).cstep = 0;
  (this->out_weight_data).data = (void *)0x0;
  (this->out_weight_data).allocator = (Allocator *)0x0;
  (this->out_weight_data).dims = 0;
  (this->out_weight_data).w = 0;
  (this->out_weight_data).w = 0;
  (this->out_weight_data).h = 0;
  (this->out_weight_data).d = 0;
  (this->out_weight_data).c = 0;
  (this->out_weight_data).cstep = 0;
  (this->out_bias_data).data = (void *)0x0;
  (this->out_bias_data).elempack = 0;
  (this->out_bias_data).refcount = (int *)0x0;
  (this->out_bias_data).elemsize = 0;
  (this->out_bias_data).w = 0;
  (this->out_bias_data).h = 0;
  (this->out_bias_data).d = 0;
  (this->out_bias_data).c = 0;
  (this->out_bias_data).allocator = (Allocator *)0x0;
  (this->out_bias_data).dims = 0;
  (this->out_bias_data).w = 0;
  (this->q_weight_data_int8_scales).refcount = (int *)0x0;
  (this->q_weight_data_int8_scales).elemsize = 0;
  (this->out_bias_data).cstep = 0;
  (this->q_weight_data_int8_scales).data = (void *)0x0;
  (this->q_weight_data_int8_scales).elempack = 0;
  (this->q_weight_data_int8_scales).w = 0;
  (this->q_weight_data_int8_scales).h = 0;
  (this->q_weight_data_int8_scales).d = 0;
  (this->q_weight_data_int8_scales).c = 0;
  (this->q_weight_data_int8_scales).allocator = (Allocator *)0x0;
  (this->q_weight_data_int8_scales).dims = 0;
  (this->q_weight_data_int8_scales).w = 0;
  (this->k_weight_data_int8_scales).refcount = (int *)0x0;
  (this->k_weight_data_int8_scales).elemsize = 0;
  (this->q_weight_data_int8_scales).cstep = 0;
  (this->k_weight_data_int8_scales).data = (void *)0x0;
  (this->k_weight_data_int8_scales).elempack = 0;
  (this->k_weight_data_int8_scales).w = 0;
  (this->k_weight_data_int8_scales).h = 0;
  (this->k_weight_data_int8_scales).d = 0;
  (this->k_weight_data_int8_scales).c = 0;
  (this->k_weight_data_int8_scales).allocator = (Allocator *)0x0;
  (this->k_weight_data_int8_scales).dims = 0;
  (this->k_weight_data_int8_scales).w = 0;
  (this->v_weight_data_int8_scales).elempack = 0;
  (this->v_weight_data_int8_scales).refcount = (int *)0x0;
  (this->v_weight_data_int8_scales).elemsize = 0;
  (this->k_weight_data_int8_scales).cstep = 0;
  (this->v_weight_data_int8_scales).data = (void *)0x0;
  (this->v_weight_data_int8_scales).w = 0;
  (this->v_weight_data_int8_scales).h = 0;
  (this->v_weight_data_int8_scales).d = 0;
  (this->v_weight_data_int8_scales).c = 0;
  (this->v_weight_data_int8_scales).allocator = (Allocator *)0x0;
  (this->v_weight_data_int8_scales).dims = 0;
  (this->v_weight_data_int8_scales).w = 0;
  return;
}

Assistant:

MultiHeadAttention::MultiHeadAttention()
{
}